

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Decoder.c
# Opt level: O0

ZyanStatus
ZydisNodeHandlerMandatoryPrefix
          (ZydisDecoderState *state,ZydisDecodedInstruction *instruction,ZyanU16 *index)

{
  ZyanU8 ZVar1;
  ZyanU16 *index_local;
  ZydisDecodedInstruction *instruction_local;
  ZydisDecoderState *state_local;
  
  if (state == (ZydisDecoderState *)0x0) {
    __assert_fail("state",
                  "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                  ,0xf4a,
                  "ZyanStatus ZydisNodeHandlerMandatoryPrefix(const ZydisDecoderState *, ZydisDecodedInstruction *, ZyanU16 *)"
                 );
  }
  if (instruction != (ZydisDecodedInstruction *)0x0) {
    if (index != (ZyanU16 *)0x0) {
      ZVar1 = (state->prefixes).mandatory_candidate;
      if (ZVar1 == 'f') {
        (instruction->raw).prefixes[(state->prefixes).offset_mandatory].type =
             ZYDIS_PREFIX_TYPE_MANDATORY;
        instruction->attributes = instruction->attributes & 0xfffff7ffffffffff;
        *index = 2;
      }
      else if (ZVar1 == 0xf2) {
        (instruction->raw).prefixes[(state->prefixes).offset_mandatory].type =
             ZYDIS_PREFIX_TYPE_MANDATORY;
        *index = 4;
      }
      else if (ZVar1 == 0xf3) {
        (instruction->raw).prefixes[(state->prefixes).offset_mandatory].type =
             ZYDIS_PREFIX_TYPE_MANDATORY;
        *index = 3;
      }
      else {
        *index = 1;
      }
      return 0x100000;
    }
    __assert_fail("index",
                  "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                  ,0xf4c,
                  "ZyanStatus ZydisNodeHandlerMandatoryPrefix(const ZydisDecoderState *, ZydisDecodedInstruction *, ZyanU16 *)"
                 );
  }
  __assert_fail("instruction",
                "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c",
                0xf4b,
                "ZyanStatus ZydisNodeHandlerMandatoryPrefix(const ZydisDecoderState *, ZydisDecodedInstruction *, ZyanU16 *)"
               );
}

Assistant:

static ZyanStatus ZydisNodeHandlerMandatoryPrefix(const ZydisDecoderState* state,
    ZydisDecodedInstruction* instruction, ZyanU16* index)
{
    ZYAN_ASSERT(state);
    ZYAN_ASSERT(instruction);
    ZYAN_ASSERT(index);

    switch (state->prefixes.mandatory_candidate)
    {
    case 0x66:
        instruction->raw.prefixes[state->prefixes.offset_mandatory].type =
            ZYDIS_PREFIX_TYPE_MANDATORY;
        instruction->attributes &= ~ZYDIS_ATTRIB_HAS_OPERANDSIZE;
        *index = 2;
        break;
    case 0xF3:
        instruction->raw.prefixes[state->prefixes.offset_mandatory].type =
            ZYDIS_PREFIX_TYPE_MANDATORY;
        *index = 3;
        break;
    case 0xF2:
        instruction->raw.prefixes[state->prefixes.offset_mandatory].type =
            ZYDIS_PREFIX_TYPE_MANDATORY;
        *index = 4;
        break;
    default:
        *index = 1;
        break;
    }
    // TODO: Consume prefix and make sure it's available again, if we need to fallback

    return ZYAN_STATUS_SUCCESS;
}